

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages2::~UniformLocImplicitInSomeStages2
          (UniformLocImplicitInSomeStages2 *this)

{
  UniformLocImplicitInSomeStages2 *this_local;
  
  ~UniformLocImplicitInSomeStages2(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//One shader: uniform float u0;
		//Another shader: layout (location = 3) uniform float  u0; //not used!
		std::vector<Uniform> uniforms;

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));
		return doRun(uniforms);
	}